

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

int IFN_Previous_Character(FORM *form)

{
  int iVar1;
  int iVar2;
  
  iVar2 = form->curcol;
  form->curcol = iVar2 + -1;
  if (0 < iVar2) {
    return 0;
  }
  iVar1 = form->currow;
  form->currow = iVar1 + -1;
  if (iVar1 < 1) {
    form->currow = iVar1;
    iVar1 = -0xc;
  }
  else {
    iVar2 = form->current->dcols + -1;
    iVar1 = 0;
  }
  form->curcol = iVar2;
  return iVar1;
}

Assistant:

static int IFN_Previous_Character(FORM * form)
{
  if ((--(form->curcol))<0)
    {
      if ((--(form->currow))<0)
        {
          form->currow++;
          form->curcol++;
          return(E_REQUEST_DENIED);
        }
      form->curcol = form->current->dcols - 1;
    }
  return(E_OK);
}